

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invert.c
# Opt level: O1

OPJ_BOOL opj_matrix_inversion_f
                   (OPJ_FLOAT32 *pSrcMatrix,OPJ_FLOAT32 *pDestMatrix,OPJ_UINT32 nb_compo)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint *__s;
  OPJ_FLOAT32 *pOVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  ulong __n;
  ulong uVar11;
  float *pfVar12;
  uint *puVar13;
  float *pfVar14;
  OPJ_BOOL OVar15;
  float *pfVar16;
  void *__dest;
  OPJ_UINT32 OVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  float fVar21;
  float fVar22;
  OPJ_FLOAT32 *local_a8;
  uint local_98;
  long local_88;
  
  __s = (uint *)opj_malloc((ulong)(nb_compo << 4));
  if (__s == (uint *)0x0) {
    OVar15 = 0;
  }
  else {
    __n = (ulong)(nb_compo * 4);
    memset(__s,0,__n);
    uVar11 = (ulong)nb_compo;
    uVar3 = nb_compo - 1;
    if (nb_compo != 0) {
      lVar8 = 0;
      do {
        __s[lVar8] = (uint)lVar8;
        lVar8 = lVar8 + 1;
      } while (nb_compo != (OPJ_UINT32)lVar8);
    }
    __dest = (void *)((long)__s + __n);
    if (uVar3 != 0) {
      local_88 = 0;
      local_98 = 1;
      uVar18 = 0;
      uVar6 = 0;
      pOVar5 = pSrcMatrix;
      uVar20 = (ulong)uVar3;
      puVar13 = __s;
      local_a8 = pSrcMatrix;
      do {
        bVar1 = true;
        if (uVar18 < uVar11) {
          uVar9 = uVar18 & 0xffffffff;
          pfVar10 = (float *)pOVar5;
          fVar22 = 0.0;
          do {
            fVar21 = *pfVar10;
            if (fVar21 <= -fVar21) {
              fVar21 = -fVar21;
            }
            uVar2 = uVar9;
            if (fVar21 <= fVar22) {
              fVar21 = fVar22;
              uVar2 = uVar6;
            }
            uVar6 = uVar2;
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            pfVar10 = pfVar10 + uVar11;
            fVar22 = fVar21;
          } while (nb_compo != uVar7);
          bVar1 = fVar21 == 0.0;
        }
        if (bVar1) {
          OVar15 = 0;
          goto LAB_0010e557;
        }
        if (uVar18 != uVar6) {
          uVar7 = *puVar13;
          *puVar13 = puVar13[uVar6 - uVar18];
          puVar13[uVar6 - uVar18] = uVar7;
          memcpy(__dest,local_a8 + ((int)uVar6 - (int)uVar18) * nb_compo,__n);
          memcpy(local_a8 + ((int)uVar6 - (int)uVar18) * nb_compo,local_a8,__n);
          memcpy(local_a8,__dest,__n);
        }
        if (local_98 < nb_compo) {
          pfVar10 = (float *)(local_a8 + uVar18);
          fVar22 = *pfVar10;
          pfVar12 = pfVar10 + uVar11;
          pfVar10 = pfVar10 + 1;
          uVar7 = local_98;
          do {
            fVar21 = *pfVar12;
            *pfVar12 = fVar21 / fVar22;
            pfVar12 = pfVar12 + 1;
            lVar19 = 0;
            lVar8 = (uVar20 & 0xffffffff) << 2;
            do {
              *pfVar12 = pfVar10[lVar19] * -(fVar21 / fVar22) + *pfVar12;
              pfVar12 = pfVar12 + 1;
              lVar19 = lVar19 + 1;
              lVar8 = lVar8 + -4;
            } while ((int)uVar20 != (int)lVar19);
            pfVar10 = (float *)((long)pfVar10 - lVar8);
            pfVar12 = (float *)((long)pfVar12 - local_88);
            uVar7 = uVar7 + 1;
          } while (uVar7 != nb_compo);
        }
        local_98 = local_98 + 1;
        uVar20 = uVar20 - 1;
        local_a8 = local_a8 + uVar11;
        puVar13 = puVar13 + 1;
        uVar18 = uVar18 + 1;
        pOVar5 = (OPJ_FLOAT32 *)((float *)pOVar5 + uVar11 + 1);
        local_88 = local_88 + -4;
      } while (uVar18 != uVar3);
    }
    OVar15 = 1;
    if (nb_compo != 0) {
      pfVar10 = (float *)((long)__dest + (ulong)(nb_compo * 2) * 4);
      uVar6 = 0;
      do {
        memset(__dest,0,__n);
        *(undefined4 *)((long)__dest + uVar6 * 4) = 0x3f800000;
        OVar17 = 0;
        pOVar5 = pSrcMatrix;
        puVar13 = __s;
        pfVar12 = pfVar10;
        do {
          fVar22 = 0.0;
          if (OVar17 != 0) {
            lVar8 = 0;
            do {
              fVar22 = fVar22 + (float)pOVar5[lVar8] * pfVar10[lVar8];
              lVar8 = lVar8 + 1;
            } while (OVar17 != (OPJ_UINT32)lVar8);
          }
          uVar3 = *puVar13;
          puVar13 = puVar13 + 1;
          *pfVar12 = *(float *)((long)__dest + (ulong)uVar3 * 4) - fVar22;
          pfVar12 = pfVar12 + 1;
          OVar17 = OVar17 + 1;
          pOVar5 = pOVar5 + uVar11;
        } while (OVar17 != nb_compo);
        iVar4 = 0;
        pOVar5 = pSrcMatrix + nb_compo * nb_compo;
        pfVar14 = pfVar10 + uVar11;
        pfVar16 = (float *)((long)__dest + uVar11 * 8);
        pfVar12 = (float *)(pSrcMatrix + ((ulong)(nb_compo * nb_compo) - 1));
        OVar17 = nb_compo;
        do {
          fVar22 = 0.0;
          if (OVar17 < nb_compo) {
            lVar8 = 0;
            do {
              fVar22 = fVar22 + (float)pOVar5[lVar8] * pfVar16[lVar8];
              lVar8 = lVar8 + 1;
            } while (iVar4 != (int)lVar8);
          }
          pfVar16 = pfVar16 + -1;
          pfVar14 = pfVar14 + -1;
          OVar17 = OVar17 - 1;
          *pfVar16 = (*pfVar14 - fVar22) / *pfVar12;
          pfVar12 = pfVar12 + -(ulong)(nb_compo + 1);
          pOVar5 = pOVar5 + -(ulong)(nb_compo + 1);
          iVar4 = iVar4 + 1;
        } while (OVar17 != 0);
        uVar20 = 0;
        pOVar5 = pDestMatrix;
        do {
          *pOVar5 = *(OPJ_FLOAT32 *)((long)__dest + uVar20 * 4 + uVar11 * 4);
          uVar20 = uVar20 + 1;
          pOVar5 = pOVar5 + uVar11;
        } while (uVar11 != uVar20);
        pDestMatrix = pDestMatrix + 1;
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar11);
      OVar15 = 1;
    }
LAB_0010e557:
    opj_free(__s);
  }
  return OVar15;
}

Assistant:

OPJ_BOOL opj_matrix_inversion_f(OPJ_FLOAT32 * pSrcMatrix,
                                OPJ_FLOAT32 * pDestMatrix,
                                OPJ_UINT32 nb_compo)
{
    OPJ_BYTE * l_data = 00;
    OPJ_UINT32 l_permutation_size = nb_compo * (OPJ_UINT32)sizeof(OPJ_UINT32);
    OPJ_UINT32 l_swap_size = nb_compo * (OPJ_UINT32)sizeof(OPJ_FLOAT32);
    OPJ_UINT32 l_total_size = l_permutation_size + 3 * l_swap_size;
    OPJ_UINT32 * lPermutations = 00;
    OPJ_FLOAT32 * l_double_data = 00;

    l_data = (OPJ_BYTE *) opj_malloc(l_total_size);
    if (l_data == 0) {
        return OPJ_FALSE;
    }
    lPermutations = (OPJ_UINT32 *) l_data;
    l_double_data = (OPJ_FLOAT32 *)(l_data + l_permutation_size);
    memset(lPermutations, 0, l_permutation_size);

    if (! opj_lupDecompose(pSrcMatrix, lPermutations, l_double_data, nb_compo)) {
        opj_free(l_data);
        return OPJ_FALSE;
    }

    opj_lupInvert(pSrcMatrix, pDestMatrix, nb_compo, lPermutations, l_double_data,
                  l_double_data + nb_compo, l_double_data + 2 * nb_compo);
    opj_free(l_data);

    return OPJ_TRUE;
}